

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

double __thiscall
NJamSpell::TLangModel::GetGram3Prob(TLangModel *this,TWordId word1,TWordId word2,TWordId word3)

{
  TCount TVar1;
  TCount TVar2;
  double local_30;
  double countsGram3;
  double countsGram2;
  TWordId word3_local;
  TWordId word2_local;
  TWordId word1_local;
  TLangModel *this_local;
  
  TVar1 = GetGram2HashCount(this,word1,word2);
  TVar2 = GetGram3HashCount(this,word1,word2,word3);
  local_30 = (double)TVar2;
  if ((double)TVar1 < local_30) {
    local_30 = 0.0;
  }
  return (this->K + local_30) / ((double)this->TotalWords + (double)TVar1);
}

Assistant:

double TLangModel::GetGram3Prob(TWordId word1, TWordId word2, TWordId word3) const {
    double countsGram2 = GetGram2HashCount(word1, word2);
    double countsGram3 = GetGram3HashCount(word1, word2, word3);
    if (countsGram3 > countsGram2) { // hash collision
        countsGram3 = 0;
    }
    countsGram2 += TotalWords;
    countsGram3 += K;
    return countsGram3 / countsGram2;
}